

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O3

int __thiscall ncnn::LRN::forward_inplace(LRN *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  void *pvVar5;
  LRN *pLVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  void *pvVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  void *pvVar15;
  int *piVar16;
  int *piVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  ulong local_150;
  allocator_type local_139;
  Option *local_138;
  int *local_130;
  void *local_128;
  ulong local_120;
  void *ptr_1;
  int *piStack_110;
  ulong local_108;
  int local_100;
  Allocator *local_f8;
  int iStack_f0;
  uint uStack_ec;
  uint local_e8;
  uint local_e4;
  ulong local_e0;
  int *local_d0;
  long local_c8;
  LRN *local_c0;
  Mat local_b8;
  long local_78;
  void *local_70;
  long local_68;
  void *local_60;
  void *ptr;
  Allocator *pAStack_50;
  Allocator *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  uVar23 = bottom_top_blob->w;
  local_b8.h = bottom_top_blob->h;
  local_120 = (ulong)(uint)local_b8.h;
  uVar9 = bottom_top_blob->c;
  piVar17 = (int *)(ulong)uVar9;
  uVar20 = bottom_top_blob->elemsize;
  uVar14 = local_b8.h * uVar23;
  local_b8.allocator = opt->workspace_allocator;
  local_b8.data = (void *)0x0;
  local_b8.refcount = (int *)0x0;
  local_b8.elempack = 1;
  local_b8.dims = 3;
  pvVar11 = (void *)((long)(int)uVar14 * uVar20 + 0xf & 0xfffffffffffffff0);
  local_b8.cstep = (ulong)pvVar11 / uVar20;
  lVar18 = local_b8.cstep * (long)(int)uVar9;
  iVar8 = -100;
  local_b8.elemsize = uVar20;
  local_b8.w = uVar23;
  local_b8.c = uVar9;
  if (lVar18 != 0) {
    uVar19 = lVar18 * uVar20 + 3 & 0xfffffffffffffffc;
    local_138 = opt;
    local_128 = pvVar11;
    if (local_b8.allocator == (Allocator *)0x0) {
      ptr_1 = (void *)0x0;
      iVar7 = posix_memalign(&ptr_1,0x10,uVar19 + 4);
      local_b8.data = (void *)0x0;
      if (iVar7 == 0) {
        local_b8.data = ptr_1;
      }
    }
    else {
      local_b8.data =
           (void *)(**(code **)(*(long *)local_b8.allocator + 0x10))(local_b8.allocator,uVar19 + 4);
    }
    local_b8.refcount = (int *)((long)local_b8.data + uVar19);
    *(undefined4 *)((long)local_b8.data + uVar19) = 1;
    if (local_b8.cstep * (long)local_b8.c != 0) {
      if (0 < (int)uVar9) {
        pvVar11 = bottom_top_blob->data;
        sVar1 = bottom_top_blob->cstep;
        sVar2 = bottom_top_blob->elemsize;
        piVar16 = (int *)0x0;
        pvVar15 = local_b8.data;
        do {
          if (0 < (int)uVar14) {
            uVar19 = 0;
            do {
              fVar25 = *(float *)((long)pvVar11 + uVar19 * 4);
              *(float *)((long)pvVar15 + uVar19 * 4) = fVar25 * fVar25;
              uVar19 = uVar19 + 1;
            } while (uVar14 != uVar19);
          }
          piVar16 = (int *)((long)piVar16 + 1);
          pvVar15 = (void *)((long)pvVar15 + local_b8.elemsize * local_b8.cstep);
          pvVar11 = (void *)((long)pvVar11 + sVar1 * sVar2);
        } while (piVar16 != piVar17);
      }
      local_c0 = this;
      if (this->region_type == 0) {
        local_f8 = local_138->workspace_allocator;
        ptr_1 = (void *)0x0;
        piStack_110 = (int *)0x0;
        local_100 = 1;
        uStack_ec = uVar23;
        iStack_f0 = 3;
        local_e8 = (uint)local_120;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar20;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_128;
        local_e0 = SUB168(auVar4 / auVar3,0);
        lVar18 = (long)(int)uVar9 * local_e0;
        local_108 = uVar20;
        local_e4 = uVar9;
        if (lVar18 != 0) {
          uVar19 = lVar18 * uVar20 + 3 & 0xfffffffffffffffc;
          if (local_f8 == (Allocator *)0x0) {
            ptr = (void *)0x0;
            iVar8 = posix_memalign(&ptr,0x10,uVar19 + 4);
            ptr_1 = (void *)0x0;
            if (iVar8 == 0) {
              ptr_1 = ptr;
            }
          }
          else {
            ptr_1 = (void *)(**(code **)(*(long *)local_f8 + 0x10))();
          }
          local_130 = (int *)((long)ptr_1 + uVar19);
          *(undefined4 *)((long)ptr_1 + uVar19) = 1;
          uVar23 = SUB164(auVar4 / auVar3,0) * uVar9;
          piStack_110 = local_130;
          if (0 < (int)uVar23) {
            memset(ptr_1,0,(ulong)uVar23 << 2);
          }
          if (0 < (int)uVar9) {
            fVar25 = local_c0->alpha;
            uVar23 = local_c0->local_size / 2;
            local_120 = (ulong)-uVar23;
            pvVar11 = bottom_top_blob->data;
            local_c8 = (long)(int)uVar23;
            fVar26 = 1.0 / (float)local_c0->local_size;
            lVar18 = uVar20 * local_e0;
            local_128 = (void *)(bottom_top_blob->cstep * bottom_top_blob->elemsize);
            piVar16 = (int *)0x0;
            local_138 = (Option *)CONCAT44(local_138._4_4_,fVar26);
            pvVar15 = ptr_1;
            local_d0 = piVar17;
            do {
              pLVar6 = local_c0;
              uVar9 = (int)local_120 + (int)piVar16;
              if ((long)(int)uVar9 <= local_c8 + (long)piVar16) {
                do {
                  if (((int)uVar9 < (int)local_d0 && -1 < (int)uVar9) && (0 < (int)uVar14)) {
                    uVar20 = 0;
                    do {
                      *(float *)((long)pvVar15 + uVar20 * 4) =
                           *(float *)((long)pvVar15 + uVar20 * 4) +
                           *(float *)((long)local_b8.data +
                                     uVar20 * 4 + (ulong)uVar9 * local_b8.cstep * local_b8.elemsize)
                      ;
                      uVar20 = uVar20 + 1;
                    } while (uVar14 != uVar20);
                  }
                  bVar24 = uVar9 != uVar23;
                  uVar9 = uVar9 + 1;
                } while (bVar24);
              }
              if (0 < (int)uVar14) {
                uVar20 = 0;
                do {
                  fVar26 = powf(*(float *)((long)pvVar15 + uVar20 * 4) * fVar25 * fVar26 +
                                pLVar6->bias,-pLVar6->beta);
                  *(float *)((long)pvVar11 + uVar20 * 4) =
                       fVar26 * *(float *)((long)pvVar11 + uVar20 * 4);
                  uVar20 = uVar20 + 1;
                  fVar26 = local_138._0_4_;
                } while (uVar14 != uVar20);
              }
              uVar23 = uVar23 + 1;
              piVar16 = (int *)((long)piVar16 + 1);
              pvVar15 = (void *)((long)pvVar15 + lVar18);
              pvVar11 = (void *)((long)pvVar11 + (long)local_128);
            } while (piVar16 != local_d0);
          }
          LOCK();
          *local_130 = *local_130 + -1;
          UNLOCK();
          if (*local_130 == 0) {
            if (local_f8 == (Allocator *)0x0) {
              if (ptr_1 != (void *)0x0) {
                free(ptr_1);
              }
            }
            else {
              (**(code **)(*(long *)local_f8 + 0x18))();
            }
          }
          iVar8 = 0;
        }
      }
      else {
        iVar8 = 0;
        if (this->region_type == 1) {
          local_108 = local_b8.elemsize;
          local_100 = local_b8.elempack;
          uStack_ec = local_b8.w;
          iStack_f0 = local_b8.dims;
          local_f8 = local_b8.allocator;
          local_e8 = local_b8.h;
          local_e4 = local_b8.c;
          local_e0 = local_b8.cstep;
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
          uVar9 = this->local_size;
          uVar14 = uVar23;
          ptr_1 = local_b8.data;
          piStack_110 = local_b8.refcount;
          if (1 < (int)uVar9) {
            uVar14 = uVar9 >> 1;
            local_38._0_1_ = local_138->use_int8_arithmetic;
            local_38._1_1_ = local_138->use_packing_layout;
            local_38._2_1_ = local_138->use_shader_pack8;
            local_38._3_1_ = local_138->use_bf16_storage;
            local_38._4_4_ = *(undefined4 *)&local_138->field_0x24;
            ptr = *(void **)local_138;
            local_48 = local_138->workspace_allocator;
            uStack_40._0_1_ = local_138->use_winograd_convolution;
            uStack_40._1_1_ = local_138->use_sgemm_convolution;
            uStack_40._2_1_ = local_138->use_int8_inference;
            uStack_40._3_1_ = local_138->use_vulkan_compute;
            uStack_40._4_1_ = local_138->use_fp16_packed;
            uStack_40._5_1_ = local_138->use_fp16_storage;
            uStack_40._6_1_ = local_138->use_fp16_arithmetic;
            uStack_40._7_1_ = local_138->use_int8_storage;
            pAStack_50 = local_138->workspace_allocator;
            copy_make_border(&local_b8,(Mat *)&ptr_1,uVar14,~uVar14 + uVar9,uVar14,~uVar14 + uVar9,0
                             ,0.0,(Option *)&ptr);
            if ((ptr_1 == (void *)0x0) || ((long)(int)local_e4 * local_e0 == 0)) {
              if (piStack_110 != (int *)0x0) {
                LOCK();
                *piStack_110 = *piStack_110 + -1;
                UNLOCK();
                if (*piStack_110 == 0) {
                  if (local_f8 == (Allocator *)0x0) {
                    if (ptr_1 != (void *)0x0) {
                      free(ptr_1);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_f8 + 0x18))();
                  }
                }
              }
              iVar8 = -100;
              goto LAB_00133916;
            }
            uVar9 = this->local_size;
            uVar14 = uStack_ec;
          }
          uVar22 = uVar9 * uVar9;
          local_138 = (Option *)CONCAT44(local_138._4_4_,this->alpha);
          local_d0 = piVar17;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&ptr,(ulong)uVar22,&local_139);
          pvVar11 = ptr;
          iVar8 = this->local_size;
          if (0 < iVar8) {
            iVar21 = uVar14 - iVar8;
            iVar7 = 0;
            iVar10 = 0;
            iVar12 = 0;
            do {
              if (0 < iVar8) {
                lVar18 = 0;
                do {
                  *(int *)((long)ptr + lVar18 * 4 + (long)iVar12 * 4) = iVar10 + (int)lVar18;
                  iVar8 = this->local_size;
                  lVar18 = lVar18 + 1;
                  iVar13 = (int)lVar18;
                } while (iVar13 < iVar8);
                iVar12 = iVar12 + iVar13;
                iVar10 = iVar10 + iVar13;
              }
              iVar10 = iVar10 + iVar21;
              iVar7 = iVar7 + 1;
            } while (iVar7 < iVar8);
          }
          if (0 < (int)local_d0) {
            local_60 = bottom_top_blob->data;
            local_68 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
            local_70 = ptr_1;
            local_78 = local_e0 * local_108;
            local_c8 = (long)(int)uStack_ec * local_108;
            local_130 = (int *)0x0;
            do {
              if (0 < (int)local_120) {
                local_128 = (void *)(local_78 * (long)local_130 + (long)local_70);
                pvVar15 = (void *)(local_68 * (long)local_130 + (long)local_60);
                local_150 = 0;
                do {
                  pvVar5 = local_128;
                  if (0 < (int)uVar23) {
                    lVar18 = local_150 * local_c8;
                    uVar20 = 0;
                    do {
                      if (uVar9 == 0) {
                        fVar25 = 0.0;
                      }
                      else {
                        fVar25 = 0.0;
                        uVar19 = 0;
                        do {
                          fVar25 = fVar25 + *(float *)((long)pvVar5 +
                                                      (long)*(int *)((long)pvVar11 + uVar19 * 4) * 4
                                                      + uVar20 * 4 + lVar18);
                          uVar19 = uVar19 + 1;
                        } while (uVar22 + (uVar22 == 0) != uVar19);
                      }
                      fVar25 = powf(fVar25 * local_138._0_4_ * (1.0 / (float)(int)uVar22) +
                                    local_c0->bias,-local_c0->beta);
                      *(float *)((long)pvVar15 + uVar20 * 4) =
                           fVar25 * *(float *)((long)pvVar15 + uVar20 * 4);
                      uVar20 = uVar20 + 1;
                    } while (uVar20 != uVar23);
                  }
                  pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar23 * 4);
                  local_150 = local_150 + 1;
                } while (local_150 != local_120);
              }
              local_130 = (int *)((long)local_130 + 1);
            } while (local_130 != local_d0);
          }
          if (pvVar11 != (void *)0x0) {
            operator_delete(pvVar11,(long)local_48 - (long)pvVar11);
          }
          iVar8 = 0;
          if (piStack_110 != (int *)0x0) {
            LOCK();
            *piStack_110 = *piStack_110 + -1;
            UNLOCK();
            if (*piStack_110 == 0) {
              if (local_f8 == (Allocator *)0x0) {
                if (ptr_1 != (void *)0x0) {
                  free(ptr_1);
                }
              }
              else {
                (**(code **)(*(long *)local_f8 + 0x18))();
              }
            }
          }
        }
      }
    }
  }
LAB_00133916:
  if (local_b8.refcount != (int *)0x0) {
    LOCK();
    *local_b8.refcount = *local_b8.refcount + -1;
    UNLOCK();
    if (*local_b8.refcount == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_b8.allocator + 0x18))();
      }
    }
  }
  return iVar8;
}

Assistant:

int LRN::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            outptr[i] = ptr[i] * ptr[i];
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            // square sum
            float* ssptr = square_sum.channel(q);
            for (int p=q - local_size / 2; p<=q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                for (int i=0; i<size; i++)
                {
                    ssptr[i] += sptr[i];
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            for (int i=0; i<size; i++)
            {
                ptr[i] = static_cast<float>(ptr[i] * pow(bias + alpha_div_size * ssptr[i], -beta));
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        ss += val;
                    }

                    ptr[j] = static_cast<float>(ptr[j] * pow(bias + alpha_div_size * ss, -beta));
                }

                ptr += outw;
            }
        }
    }

    return 0;
}